

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<int,false,std::allocator<unsigned_long>>::
assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long_const*>
          (View<int,false,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                end,unsigned_long *it,pointer data,CoordinateOrder *internalCoordinateOrder,
          allocator_type *allocator)

{
  allocator<unsigned_long> local_81;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_80;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_78;
  Geometry<std::allocator<unsigned_long>_> local_70;
  CoordinateOrder *local_38;
  CoordinateOrder *internalCoordinateOrder_local;
  pointer data_local;
  unsigned_long *it_local;
  View<int,_false,_std::allocator<unsigned_long>_> *this_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  end_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_local;
  
  local_80._M_current = end._M_current;
  local_78._M_current = begin._M_current;
  local_38 = internalCoordinateOrder;
  internalCoordinateOrder_local = (CoordinateOrder *)data;
  data_local = (pointer)it;
  it_local = (unsigned_long *)this;
  this_local = (View<int,_false,_std::allocator<unsigned_long>_> *)end._M_current;
  end_local = begin;
  std::allocator<unsigned_long>::allocator<int>(&local_81,allocator);
  marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long_const*>
            ((Geometry<std::allocator<unsigned_long>> *)&local_70,local_78,local_80,it,
             internalCoordinateOrder,&local_81);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
            ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_70);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_70);
  std::allocator<unsigned_long>::~allocator(&local_81);
  *(CoordinateOrder **)this = internalCoordinateOrder_local;
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline void
View<T, isConst, A>::assign
(
    ShapeIterator begin,
    ShapeIterator end,
    StrideIterator it,
    pointer data,
    const CoordinateOrder& internalCoordinateOrder,
    const allocator_type& allocator
)
{
    // the invariant is not tested as a pre-condition of this
    // function to allow for unsafe manipulations prior to its
    // call
    geometry_ = typename marray_detail::Geometry<A>(begin, end, 
        it, internalCoordinateOrder, allocator);
    data_ = data;
    testInvariant();
}